

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::QListView(QListView *this,QWidget *parent)

{
  void *pvVar1;
  QAbstractItemView *in_RSI;
  QListViewPrivate *in_RDI;
  QListViewPrivate *d;
  QFramePrivate *in_stack_00000038;
  bool in_stack_00000043;
  WidgetAttribute in_stack_00000044;
  QWidget *in_stack_00000048;
  SelectionMode mode;
  QAbstractItemViewPrivate *in_stack_ffffffffffffffe8;
  
  pvVar1 = operator_new(0x5c0);
  mode = (SelectionMode)((ulong)pvVar1 >> 0x20);
  QListViewPrivate::QListViewPrivate(in_RDI);
  QAbstractItemView::QAbstractItemView(in_RSI,in_stack_ffffffffffffffe8,(QWidget *)in_RDI);
  *(undefined ***)
   &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
    super_QWidgetPrivate = &PTR_metaObject_00d2e7f8;
  *(undefined ***)
   &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
    super_QWidgetPrivate.field_0x10 = &PTR__QListView_00d2eb08;
  setViewMode((QListView *)parent,d._4_4_);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)in_RDI,mode);
  QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
  d_func((QListView *)0x87646d);
  QFramePrivate::updateStyledFrameWidths(in_stack_00000038);
  return;
}

Assistant:

QListView::QListView(QWidget *parent)
    : QAbstractItemView(*new QListViewPrivate, parent)
{
    setViewMode(ListMode);
    setSelectionMode(SingleSelection);
    setAttribute(Qt::WA_MacShowFocusRect);
    Q_D(QListView);               // We rely on a qobject_cast for PM_DefaultFrameWidth to change
    d->updateStyledFrameWidths(); // hence we have to force an update now that the object has been constructed
}